

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_epsv_disable(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  int *piVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  ConnectBits CVar5;
  
  CVar5 = conn->bits;
  if ((CVar5._0_4_ & 0x80a) == 0x800) {
    Curl_failf(data,"Failed EPSV attempt, exiting");
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) {
      Curl_infof(data,"Failed EPSV attempt. Disabling EPSV");
      CVar5 = conn->bits;
    }
    conn->bits = (ConnectBits)((ulong)CVar5 & 0xffffffffffff7fff);
    Curl_conn_close(data,1);
    Curl_conn_cf_discard_all(data,conn,1);
    puVar1 = &(data->state).field_0x774;
    *puVar1 = *puVar1 & 0xf7;
    CVar4 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","PASV");
    if (CVar4 == CURLE_OK) {
      piVar2 = &(conn->proto).ftpc.count1;
      *piVar2 = *piVar2 + 1;
      _ftp_state(data,'\x1e');
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_epsv_disable(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.ipv6
#ifndef CURL_DISABLE_PROXY
     && !(conn->bits.tunnel_proxy || conn->bits.socksproxy)
#endif
    ) {
    /* We cannot disable EPSV when doing IPv6, so this is instead a fail */
    failf(data, "Failed EPSV attempt, exiting");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  infof(data, "Failed EPSV attempt. Disabling EPSV");
  /* disable it for next transfer */
  conn->bits.ftp_use_epsv = FALSE;
  Curl_conn_close(data, SECONDARYSOCKET);
  Curl_conn_cf_discard_all(data, conn, SECONDARYSOCKET);
  data->state.errorbuf = FALSE; /* allow error message to get
                                         rewritten */
  result = Curl_pp_sendf(data, &conn->proto.ftpc.pp, "%s", "PASV");
  if(!result) {
    conn->proto.ftpc.count1++;
    /* remain in/go to the FTP_PASV state */
    ftp_state(data, FTP_PASV);
  }
  return result;
}